

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::deriveECDH(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
                   CK_OBJECT_HANDLE hBaseKey,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
                   CK_OBJECT_HANDLE_PTR phKey,CK_KEY_TYPE keyType,CK_BBOOL isOnToken,
                   CK_BBOOL isPrivate)

{
  uchar uVar1;
  CK_ATTRIBUTE_TYPE CVar2;
  ulong uVar3;
  void *pvVar4;
  CK_KEY_TYPE CVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  Session *this_00;
  CryptoFactory *pCVar9;
  SoftHSM *pSVar10;
  ECPrivateKey *privateKey;
  CK_RV CVar11;
  uchar *puVar12;
  ECPublicKey *publicKey;
  long *plVar13;
  undefined4 extraout_var_02;
  size_t sVar14;
  byte *pbVar15;
  unsigned_long *puVar16;
  ulong uVar17;
  CK_ULONG CVar18;
  CK_ULONG CVar19;
  size_t i_1;
  undefined8 uVar20;
  SoftHSM *this_01;
  char *pcVar21;
  CK_ULONG i;
  bool bVar22;
  ulong uStack_520;
  ulong local_518;
  SymmetricKey *secret;
  SoftHSM *local_500;
  OSObject *local_4f8;
  Token *local_4f0;
  uint local_4e4;
  ByteString secretValue;
  OSAttribute local_4a8;
  ByteString plainKCV;
  ByteString kcv;
  ByteString value;
  CK_OBJECT_CLASS objClass;
  ByteString publicData;
  ByteString local_360;
  CK_ATTRIBUTE secretAttribs [32];
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  CVar5 = keyType;
  *phKey = 0;
  plVar13 = (long *)pMechanism->pParameter;
  if ((plVar13 == (long *)0x0) || (pMechanism->ulParameterLen != 0x28)) {
    pcVar21 = "pParameter must be of type CK_ECDH1_DERIVE_PARAMS";
    iVar8 = 0x2978;
LAB_001446ee:
    softHSMLog(7,"deriveECDH",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar8,pcVar21);
    return 0x71;
  }
  if (*plVar13 != 1) {
    pcVar21 = "kdf must be CKD_NULL";
    iVar8 = 0x297d;
    goto LAB_001446ee;
  }
  if ((plVar13[1] != 0) || (plVar13[2] != 0)) {
    pcVar21 = "there must be no shared data";
    iVar8 = 0x2983;
    goto LAB_001446ee;
  }
  if ((plVar13[3] == 0) || (plVar13[4] == 0)) {
    pcVar21 = "there must be a public data";
    iVar8 = 0x2989;
    goto LAB_001446ee;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_4f0 = Session::getToken(this_00);
  if (local_4f0 == (Token *)0x0) {
    return 5;
  }
  puVar16 = &pTemplate->ulValueLen;
  uVar20 = CONCAT71((int7)((ulong)this_00 >> 8),1);
  uVar17 = 0;
  CVar11 = 0x13;
  CVar19 = ulCount;
  while (bVar22 = CVar19 != 0, CVar19 = CVar19 - 1, local_500 = this, bVar22) {
    CVar2 = ((_CK_ATTRIBUTE *)(puVar16 + -2))->type;
    if (CVar2 == 0x90) {
      if (*puVar16 != 0) {
        pcVar21 = "CKA_CHECK_VALUE must be a no-value (0 length) entry";
        iVar8 = 0x29ac;
        goto LAB_00144960;
      }
      uVar20 = 0;
    }
    else if (CVar2 == 0x161) {
      if (*puVar16 != 8) {
        pcVar21 = "CKA_VALUE_LEN does not have the size of CK_ULONG";
        iVar8 = 0x29a4;
        goto LAB_00144960;
      }
      uVar17 = *(ulong *)puVar16[-1];
    }
    else if (CVar2 == 0x11) {
      CVar11 = 0x10;
      pcVar21 = "CKA_VALUE must not be included";
      iVar8 = 0x299f;
      goto LAB_00144960;
    }
    puVar16 = puVar16 + 3;
  }
  local_518 = uVar17;
  switch(CVar5) {
  case 0x10:
    break;
  case 0x11:
  case 0x12:
    return 0x13;
  case 0x13:
    if ((uVar17 & 0xfffffffffffffff7) != 0) {
      pcVar21 = "CKA_VALUE_LEN must be 0 or 8";
      iVar8 = 0x29c0;
LAB_00144960:
      softHSMLog(6,"deriveECDH",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar8,pcVar21);
      return CVar11;
    }
    uStack_520 = 8;
    local_518 = uStack_520;
    break;
  case 0x14:
    if ((uVar17 & 0xffffffffffffffef) != 0) {
      pcVar21 = "CKA_VALUE_LEN must be 0 or 16";
      iVar8 = 0x29c9;
      goto LAB_00144960;
    }
    uStack_520 = 0x10;
    local_518 = uStack_520;
    break;
  case 0x15:
    local_518 = 0x18;
    if ((uVar17 != 0) && (uVar17 != 0x18)) {
      pcVar21 = "CKA_VALUE_LEN must be 0 or 24";
      iVar8 = 0x29d1;
      goto LAB_00144960;
    }
    break;
  default:
    if (CVar5 != 0x1f) {
      return 0x13;
    }
    uVar17 = uVar17 << 0x3d | uVar17 >> 3;
    if ((4 < uVar17) || (uVar17 == 1)) {
      pcVar21 = "CKA_VALUE_LEN must be 0, 16, 24, or 32";
      iVar8 = 0x29d9;
      goto LAB_00144960;
    }
  }
  local_4e4 = (uint)uVar20;
  local_4f8 = (OSObject *)HandleManager::getObject(this->handleManager,hBaseKey);
  if (local_4f8 == (OSObject *)0x0) {
    return 0x60;
  }
  iVar8 = (*local_4f8->_vptr_OSObject[10])(local_4f8);
  if ((char)iVar8 == '\0') {
    return 0x60;
  }
  pCVar9 = CryptoFactory::i();
  iVar8 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,4);
  pSVar10 = (SoftHSM *)CONCAT44(extraout_var,iVar8);
  if (pSVar10 == (SoftHSM *)0x0) {
    return 0x70;
  }
  this_01 = pSVar10;
  iVar8 = (*pSVar10->_vptr_SoftHSM[0x16])();
  privateKey = (ECPrivateKey *)CONCAT44(extraout_var_00,iVar8);
  if (privateKey == (ECPrivateKey *)0x0) {
    pCVar9 = CryptoFactory::i();
    (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,pSVar10);
    return 2;
  }
  CVar11 = getECPrivateKey(this_01,privateKey,local_4f0,local_4f8);
  if (CVar11 != 0) {
    (*pSVar10->_vptr_SoftHSM[0x1b])(pSVar10,privateKey);
    pCVar9 = CryptoFactory::i();
    (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,pSVar10);
    return 5;
  }
  ByteString::ByteString(&publicData);
  ByteString::resize(&publicData,*(size_t *)((long)pMechanism->pParameter + 0x18));
  puVar12 = ByteString::operator[](&publicData,0);
  memcpy(puVar12,*(void **)((long)pMechanism->pParameter + 0x20),
         *(size_t *)((long)pMechanism->pParameter + 0x18));
  iVar8 = (*pSVar10->_vptr_SoftHSM[0x15])();
  publicKey = (ECPublicKey *)CONCAT44(extraout_var_01,iVar8);
  if (publicKey == (ECPublicKey *)0x0) {
    (*pSVar10->_vptr_SoftHSM[0x1b])(pSVar10,privateKey);
    pCVar9 = CryptoFactory::i();
    (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,pSVar10);
    uStack_520 = 2;
    goto LAB_00144b1e;
  }
  CVar11 = getECDHPublicKey(local_500,publicKey,privateKey,&publicData);
  if (CVar11 != 0) {
    (*pSVar10->_vptr_SoftHSM[0x1b])(pSVar10,privateKey);
    (*pSVar10->_vptr_SoftHSM[0x1a])(pSVar10,publicKey);
    pCVar9 = CryptoFactory::i();
    (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,pSVar10);
    uStack_520 = 5;
    goto LAB_00144b1e;
  }
  secret = (SymmetricKey *)0x0;
  iVar8 = (*pSVar10->_vptr_SoftHSM[0x10])(pSVar10,&secret,publicKey,privateKey);
  (*pSVar10->_vptr_SoftHSM[0x1b])(pSVar10,privateKey);
  (*pSVar10->_vptr_SoftHSM[0x1a])();
  objClass = 4;
  memset(secretAttribs,0,0x300);
  secretAttribs[0].ulValueLen = 8;
  secretAttribs[1].type = 1;
  secretAttribs[1].pValue = &isOnToken;
  secretAttribs[1].ulValueLen = 1;
  secretAttribs[2].type = 2;
  secretAttribs[2].pValue = &isPrivate;
  secretAttribs[2].ulValueLen = 1;
  secretAttribs[3].type = 0x100;
  secretAttribs[3].pValue = &keyType;
  secretAttribs[3].ulValueLen = 8;
  bVar6 = ulCount < 0x1d & (byte)iVar8;
  CVar19 = 4;
  for (uVar17 = 0; (bVar6 & uVar17 < ulCount) != 0; uVar17 = uVar17 + 1) {
    uVar3 = pTemplate->type;
    CVar18 = CVar19;
    if (((2 < uVar3) && (uVar3 != 0x90)) && (uVar3 != 0x100)) {
      CVar18 = CVar19 + 1;
      secretAttribs[CVar19].ulValueLen = pTemplate->ulValueLen;
      pvVar4 = pTemplate->pValue;
      secretAttribs[CVar19].type = pTemplate->type;
      secretAttribs[CVar19].pValue = pvVar4;
    }
    pTemplate = pTemplate + 1;
    CVar19 = CVar18;
  }
  uStack_520 = 0xd1;
  if (ulCount < 0x1d) {
    uStack_520 = (ulong)(byte)((byte)iVar8 ^ 1) * 5;
  }
  secretAttribs[0].pValue = &objClass;
  if ((bVar6 != 0) &&
     (uStack_520 = CreateObject(local_500,hSession,secretAttribs,CVar19,phKey,3), uStack_520 == 0))
  {
    plVar13 = (long *)HandleManager::getObject(local_500->handleManager,*phKey);
    uStack_520 = 6;
    if ((plVar13 != (long *)0x0) &&
       ((cVar7 = (**(code **)(*plVar13 + 0x50))(plVar13), uStack_520 = 6, cVar7 != '\0' &&
        (cVar7 = (**(code **)(*plVar13 + 0x58))(plVar13), cVar7 != '\0')))) {
      OSAttribute::OSAttribute(&local_4a8,false);
      cVar7 = (**(code **)(*plVar13 + 0x40))(plVar13,0x163,&local_4a8);
      OSAttribute::~OSAttribute(&local_4a8);
      iVar8 = (*local_4f8->_vptr_OSObject[4])(local_4f8,0x165,0);
      if ((char)iVar8 == '\0') {
        if (cVar7 == '\0') goto LAB_00144e25;
        OSAttribute::OSAttribute(&local_4a8,false);
        cVar7 = (**(code **)(*plVar13 + 0x40))(plVar13,0x165,&local_4a8);
LAB_00144e17:
        OSAttribute::~OSAttribute(&local_4a8);
      }
      else {
        bVar22 = (bool)(**(code **)(*plVar13 + 0x20))(plVar13,0x103,0);
        if (cVar7 != '\0') {
          OSAttribute::OSAttribute(&local_4a8,bVar22);
          cVar7 = (**(code **)(*plVar13 + 0x40))(plVar13,0x165,&local_4a8);
          goto LAB_00144e17;
        }
LAB_00144e25:
        cVar7 = '\0';
      }
      iVar8 = (*local_4f8->_vptr_OSObject[4])(local_4f8,0x164,1);
      if ((char)iVar8 == '\0') {
        if (cVar7 == '\0') goto LAB_00144eab;
        OSAttribute::OSAttribute(&local_4a8,false);
        cVar7 = (**(code **)(*plVar13 + 0x40))(plVar13,0x164,&local_4a8);
LAB_00144e9c:
        OSAttribute::~OSAttribute(&local_4a8);
      }
      else {
        bVar6 = (**(code **)(*plVar13 + 0x20))(plVar13,0x162,0);
        if (cVar7 != '\0') {
          OSAttribute::OSAttribute(&local_4a8,(bool)(bVar6 ^ 1));
          cVar7 = (**(code **)(*plVar13 + 0x40))(plVar13,0x164,&local_4a8);
          goto LAB_00144e9c;
        }
LAB_00144eab:
        cVar7 = '\0';
      }
      iVar8 = (*(secret->super_Serialisable)._vptr_Serialisable[4])();
      ByteString::ByteString(&secretValue,(ByteString *)CONCAT44(extraout_var_02,iVar8));
      ByteString::ByteString(&value);
      ByteString::ByteString(&plainKCV);
      ByteString::ByteString(&kcv);
      if (local_518 == 0) {
        if (keyType == 0x10) {
          local_518 = ByteString::size(&secretValue);
        }
        else if (keyType == 0x1f) {
          sVar14 = ByteString::size(&secretValue);
          if (sVar14 < 0x20) {
            sVar14 = ByteString::size(&secretValue);
            local_518 = (ulong)(0x17 < sVar14) * 8 + 0x10;
          }
          else {
            local_518 = 0x20;
          }
        }
        else {
          local_518 = 0;
        }
      }
      sVar14 = ByteString::size(&secretValue);
      if (sVar14 < local_518) {
        softHSMLog(6,"deriveECDH",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2a70,"The derived secret is too short");
LAB_001451e4:
        (**(code **)(*plVar13 + 0x68))(plVar13);
        uStack_520 = 6;
      }
      else {
        sVar14 = ByteString::size(&secretValue);
        if (local_518 < sVar14) {
          sVar14 = ByteString::size(&secretValue);
          ByteString::split(&local_360,&secretValue,sVar14 - local_518);
          ByteString::~ByteString(&local_360);
        }
        if (keyType - 0x13 < 3) {
          for (uVar17 = 0; sVar14 = ByteString::size(&secretValue), uVar17 < sVar14;
              uVar17 = uVar17 + 1) {
            pbVar15 = ByteString::operator[](&secretValue,uVar17);
            uVar1 = odd_parity[*pbVar15];
            puVar12 = ByteString::operator[](&secretValue,uVar17);
            *puVar12 = uVar1;
          }
        }
        if (keyType - 0x13 < 3) {
          (*(secret->super_Serialisable)._vptr_Serialisable[6])(secret,local_518 * 7);
          (*(secret->super_Serialisable)._vptr_Serialisable[5])(&local_4a8);
          ByteString::operator=(&plainKCV,(ByteString *)&local_4a8);
LAB_001450e4:
          ByteString::~ByteString((ByteString *)&local_4a8);
        }
        else {
          if (keyType == 0x1f) {
            (*(secret->super_Serialisable)._vptr_Serialisable[6])(secret,local_518 << 3);
            (*(secret->super_Serialisable)._vptr_Serialisable[5])(&local_4a8);
            ByteString::operator=(&plainKCV,(ByteString *)&local_4a8);
            goto LAB_001450e4;
          }
          if (keyType == 0x10) {
            (*(secret->super_Serialisable)._vptr_Serialisable[6])(secret,local_518 << 3);
            (*(secret->super_Serialisable)._vptr_Serialisable[5])(&local_4a8);
            ByteString::operator=(&plainKCV,(ByteString *)&local_4a8);
            goto LAB_001450e4;
          }
          cVar7 = '\0';
        }
        if (isPrivate == '\0') {
          ByteString::operator=(&value,&secretValue);
          ByteString::operator=(&kcv,&plainKCV);
        }
        else {
          Token::encrypt(local_4f0,(char *)&secretValue,(int)&value);
          Token::encrypt(local_4f0,(char *)&plainKCV,(int)&kcv);
        }
        if (cVar7 == '\0') goto LAB_001451e4;
        OSAttribute::OSAttribute(&local_4a8,&value);
        cVar7 = (**(code **)(*plVar13 + 0x40))(plVar13,0x11,&local_4a8);
        OSAttribute::~OSAttribute(&local_4a8);
        if ((local_4e4 & 1) != 0) {
          if (cVar7 == '\0') goto LAB_001451e4;
          OSAttribute::OSAttribute(&local_4a8,&kcv);
          cVar7 = (**(code **)(*plVar13 + 0x40))(plVar13,0x90,&local_4a8);
          OSAttribute::~OSAttribute(&local_4a8);
        }
        if (cVar7 == '\0') goto LAB_001451e4;
        cVar7 = (**(code **)(*plVar13 + 0x60))(plVar13);
        uStack_520 = 6;
        if (cVar7 != '\0') {
          uStack_520 = 0;
        }
      }
      ByteString::~ByteString(&kcv);
      ByteString::~ByteString(&plainKCV);
      ByteString::~ByteString(&value);
      ByteString::~ByteString(&secretValue);
    }
  }
  (*pSVar10->_vptr_SoftHSM[0x1c])(pSVar10,secret);
  pCVar9 = CryptoFactory::i();
  (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,pSVar10);
  if ((uStack_520 != 0) && (*phKey != 0)) {
    plVar13 = (long *)HandleManager::getObject(local_500->handleManager,*phKey);
    HandleManager::destroyObject(local_500->handleManager,*phKey);
    if (plVar13 != (long *)0x0) {
      (**(code **)(*plVar13 + 0x70))(plVar13);
    }
    *phKey = 0;
  }
LAB_00144b1e:
  ByteString::~ByteString(&publicData);
  return uStack_520;
}

Assistant:

CK_RV SoftHSM::deriveECDH
(CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hBaseKey,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_KEY_TYPE keyType,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	if ((pMechanism->pParameter == NULL_PTR) ||
	    (pMechanism->ulParameterLen != sizeof(CK_ECDH1_DERIVE_PARAMS)))
	{
		DEBUG_MSG("pParameter must be of type CK_ECDH1_DERIVE_PARAMS");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->kdf != CKD_NULL)
	{
		DEBUG_MSG("kdf must be CKD_NULL");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulSharedDataLen != 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pSharedData != NULL_PTR))
	{
		DEBUG_MSG("there must be no shared data");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen == 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData == NULL_PTR))
	{
		DEBUG_MSG("there must be a public data");
		return CKR_MECHANISM_PARAM_INVALID;
	}

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t byteLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE:
				INFO_MSG("CKA_VALUE must not be included");
				return CKR_ATTRIBUTE_READ_ONLY;
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				byteLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Check the length
	// byteLen == 0 impiles return max size the ECC can derive
	switch (keyType)
	{
		case CKK_GENERIC_SECRET:
			break;
#ifndef WITH_FIPS
		case CKK_DES:
			if (byteLen != 0 && byteLen != 8)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 8");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 8;
			break;
#endif
		case CKK_DES2:
			if (byteLen != 0 && byteLen != 16)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 16");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 16;
			break;
		case CKK_DES3:
			if (byteLen != 0 && byteLen != 24)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 24");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 24;
			break;
		case CKK_AES:
			if (byteLen != 0 && byteLen != 16 && byteLen != 24 && byteLen != 32)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0, 16, 24, or 32");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			break;
		default:
			return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Get the base key handle
	OSObject *baseKey = (OSObject *)handleManager->getObject(hBaseKey);
	if (baseKey == NULL || !baseKey->isValid())
		return CKR_KEY_HANDLE_INVALID;

	// Get the ECDH algorithm handler
	AsymmetricAlgorithm* ecdh = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDH);
	if (ecdh == NULL)
		return CKR_MECHANISM_INVALID;

	// Get the keys
	PrivateKey* privateKey = ecdh->newPrivateKey();
	if (privateKey == NULL)
	{
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_HOST_MEMORY;
	}
	if (getECPrivateKey((ECPrivateKey*)privateKey, token, baseKey) != CKR_OK)
	{
		ecdh->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_GENERAL_ERROR;
	}

	ByteString publicData;
	publicData.resize(CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	memcpy(&publicData[0],
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData,
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	PublicKey* publicKey = ecdh->newPublicKey();
	if (publicKey == NULL)
	{
		ecdh->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_HOST_MEMORY;
	}
	if (getECDHPublicKey((ECPublicKey*)publicKey, (ECPrivateKey*)privateKey, publicData) != CKR_OK)
	{
		ecdh->recyclePrivateKey(privateKey);
		ecdh->recyclePublicKey(publicKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_GENERAL_ERROR;
	}

	// Derive the secret
	SymmetricKey* secret = NULL;
	CK_RV rv = CKR_OK;
	if (!ecdh->deriveKey(&secret, publicKey, privateKey))
		rv = CKR_GENERAL_ERROR;
	ecdh->recyclePrivateKey(privateKey);
	ecdh->recyclePublicKey(publicKey);

	// Create the secret object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_ATTRIBUTE secretAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG secretAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - secretAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			secretAttribs[secretAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, secretAttribs, secretAttribsCount, phKey, OBJECT_OP_DERIVE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,false);

			// Common Secret Key Attributes
			if (baseKey->getBooleanValue(CKA_ALWAYS_SENSITIVE, false))
			{
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,false);
			}
			if (baseKey->getBooleanValue(CKA_NEVER_EXTRACTABLE, true))
			{
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,bNeverExtractable);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,false);
			}

			// Secret Attributes
			ByteString secretValue = secret->getKeyBits();
			ByteString value;
			ByteString plainKCV;
			ByteString kcv;

			// For generic and AES keys:
			// default to return max size available.
			if (byteLen == 0)
			{
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						byteLen = secretValue.size();
						break;
					case CKK_AES:
						if (secretValue.size() >= 32)
							byteLen = 32;
						else if (secretValue.size() >= 24)
							byteLen = 24;
						else
							byteLen = 16;
				}
			}

			if (byteLen > secretValue.size())
			{
				INFO_MSG("The derived secret is too short");
				bOK = false;
			}
			else
			{
				// Truncate value when requested, remove from the leading end
				if (byteLen < secretValue.size())
					secretValue.split(secretValue.size() - byteLen);

				// Fix the odd parity for DES
				if (keyType == CKK_DES ||
				    keyType == CKK_DES2 ||
				    keyType == CKK_DES3)
				{
					for (size_t i = 0; i < secretValue.size(); i++)
					{
						secretValue[i] = odd_parity[secretValue[i]];
					}
				}

				// Get the KCV
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						secret->setBitLen(byteLen * 8);
						plainKCV = secret->getKeyCheckValue();
						break;
					case CKK_DES:
					case CKK_DES2:
					case CKK_DES3:
						secret->setBitLen(byteLen * 7);
						plainKCV = ((DESKey*)secret)->getKeyCheckValue();
						break;
					case CKK_AES:
						secret->setBitLen(byteLen * 8);
						plainKCV = ((AESKey*)secret)->getKeyCheckValue();
						break;
					default:
						bOK = false;
						break;
				}

				if (isPrivate)
				{
					token->encrypt(secretValue, value);
					token->encrypt(plainKCV, kcv);
				}
				else
				{
					value = secretValue;
					kcv = plainKCV;
				}
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	ecdh->recycleSymmetricKey(secret);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);

	// Remove secret that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* ossecret = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (ossecret) ossecret->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}